

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  bool bVar1;
  string local_80 [32];
  string local_60;
  undefined1 local_40 [40];
  
  bVar1 = **(bool **)this;
  to_string<bool>(&local_60,*(bool **)this);
  std::__cxx11::string::string(local_80,(string *)&local_60);
  local_40[0] = bVar1;
  std::__cxx11::string::string((string *)(local_40 + 8),local_80);
  result::result(__return_storage_ptr__,(result *)local_40);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result( !!lhs, to_string( lhs ) ); }